

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Inputs.hpp
# Opt level: O2

vector<std::complex<double>,_std::allocator<std::complex<double>_>_> * __thiscall
helics::Input::getValue_impl<std::vector<std::complex<double>,std::allocator<std::complex<double>>>>
          (vector<std::complex<double>,_std::allocator<std::complex<double>_>_>
           *__return_storage_ptr__,Input *this)

{
  (__return_storage_ptr__->
  super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  getValue_impl<std::vector<std::complex<double>,std::allocator<std::complex<double>>>>
            (this,__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

X getValue_impl(std::integral_constant<int, primaryType> /*V*/)
    {
        X val;  // NOLINT
        getValue_impl(std::integral_constant<int, primaryType>(), val);
        return val;
    }